

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

ReturnType __thiscall r_comp::Preprocessor::getReturnType(Preprocessor *this,Ptr *s)

{
  bool bVar1;
  ReturnType RVar2;
  
  bVar1 = std::operator==(&((s->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr)->tail,":nb");
  if (bVar1) {
    RVar2 = NUMBER;
  }
  else {
    bVar1 = std::operator==(&((s->
                              super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->tail,":us");
    if (bVar1) {
      RVar2 = TIMESTAMP;
    }
    else {
      bVar1 = std::operator==(&((s->
                                super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr)->tail,":bl");
      if (bVar1) {
        RVar2 = BOOLEAN;
      }
      else {
        bVar1 = std::operator==(&((s->
                                  super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr)->tail,":st");
        if (bVar1) {
          RVar2 = STRING;
        }
        else {
          bVar1 = std::operator==(&((s->
                                    super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr)->tail,":nid");
          if (bVar1) {
            RVar2 = NODE_ID;
          }
          else {
            bVar1 = std::operator==(&((s->
                                      super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr)->tail,":did");
            if (bVar1) {
              RVar2 = DEVICE_ID;
            }
            else {
              bVar1 = std::operator==(&((s->
                                        super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr)->tail,":fid");
              if (bVar1) {
                RVar2 = FUNCTION_ID;
              }
              else {
                bVar1 = std::operator==(&((s->
                                          super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr)->tail,":[]");
                RVar2 = (uint)bVar1 + (uint)bVar1 * 2;
              }
            }
          }
        }
      }
    }
  }
  return RVar2;
}

Assistant:

ReturnType Preprocessor::getReturnType(RepliStruct::Ptr s)
{
    if (s->tail == ":nb") {
        return NUMBER;
    } else if (s->tail == ":us") {
        return TIMESTAMP;
    } else if (s->tail == ":bl") {
        return BOOLEAN;
    } else if (s->tail == ":st") {
        return STRING;
    } else if (s->tail == ":nid") {
        return NODE_ID;
    } else if (s->tail == ":did") {
        return DEVICE_ID;
    } else if (s->tail == ":fid") {
        return FUNCTION_ID;
    } else if (s->tail == ":[]") {
        return SET;
    }

    return ANY;
}